

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

bool __thiscall CConsole::NextParam(CConsole *this,char *pNext,char **pFormat)

{
  int iVar1;
  char *pcVar2;
  long *in_RDX;
  undefined1 *in_RSI;
  char *in_stack_ffffffffffffffd8;
  
  if (*(char *)*in_RDX != '\0') {
    *in_RDX = *in_RDX + 1;
    if (*(char *)*in_RDX == '[') {
      iVar1 = str_span((char *)in_RDX,in_stack_ffffffffffffffd8);
      *in_RDX = *in_RDX + (long)iVar1;
      if (*(char *)*in_RDX == '\0') {
        return true;
      }
      *in_RDX = *in_RDX + 1;
    }
    pcVar2 = str_skip_whitespaces_const((char *)*in_RDX);
    *in_RDX = (long)pcVar2;
  }
  *in_RSI = *(undefined1 *)*in_RDX;
  return false;
}

Assistant:

bool CConsole::NextParam(char *pNext, const char *&pFormat)
{
	if(*pFormat)
	{
		pFormat++;

		if(*pFormat == '[')
		{
			// skip bracket contents
			pFormat += str_span(pFormat, "]");
			if(!*pFormat)
				return true;

			// skip ']'
			pFormat++;
		}

		// skip space if there is one
		pFormat = str_skip_whitespaces_const(pFormat);
	}
	*pNext = *pFormat;
	return false;
}